

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

completion * __thiscall
mjs::interpreter::impl::operator()
          (completion *__return_storage_ptr__,impl *this,for_in_statement *s)

{
  gc_heap_ptr<mjs::global_object> *this_00;
  int iVar1;
  pointer pbVar2;
  statement *psVar3;
  expression *peVar4;
  bool bVar5;
  int iVar6;
  void *pvVar7;
  long *plVar8;
  object *poVar9;
  value *pvVar10;
  bool bVar11;
  label_set ls;
  object_ptr o;
  value ev_1;
  object_ptr o_1;
  value ev;
  completion c;
  label_set local_178;
  value *local_158;
  value *local_150;
  value *local_148;
  undefined1 local_140 [16];
  vector<mjs::string,_std::allocator<mjs::string>_> local_130;
  undefined1 local_118 [8];
  undefined1 local_110 [40];
  size_t local_e8;
  wchar_t *pwStack_e0;
  undefined1 local_d8 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_d0;
  wstring_view *local_b0;
  gc_heap_ptr_untyped local_a8;
  value local_98;
  completion local_70;
  
  local_178.
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((for_in_statement *)this->labels_valid_for_ == s) {
    local_178.
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->label_set_).
         super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_178.
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->label_set_).
         super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_178.
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->label_set_).
         super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->label_set_).
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->label_set_).
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->label_set_).
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    pbVar2 = (this->label_set_).
             super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->label_set_).
        super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar2) {
      (this->label_set_).
      super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
    }
  }
  this->labels_valid_for_ = (statement *)0x0;
  this_00 = &this->global_;
  pvVar7 = gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
  iVar1 = *(int *)((long)pvVar7 + 0x20);
  completion::completion(&local_70,(value *)&value::undefined,normal);
  iVar6 = (**(code **)((long)(((s->init_)._M_t.
                               super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                               .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl)->
                             super_syntax_node)._vptr_syntax_node + 0x18))();
  if (iVar6 == 4) {
    eval((value *)local_118,this,
         (s->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
         _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value(&local_98,this,(value *)local_118);
    value::destroy((value *)local_118);
    if ((1 < iVar1) && (local_98.type_ < boolean)) {
      completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
      value::destroy(&local_98);
      goto LAB_0011f682;
    }
    plVar8 = (long *)gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar8 + 0x88))(local_140,plVar8,&local_98);
    local_148 = (value *)(s->init_)._M_t.
                         super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                         .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl[1].
                         super_syntax_node._vptr_syntax_node;
    poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_140);
    object::enumerable_property_names(&local_130,poVar9);
    local_150 = (value *)local_130.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    bVar11 = local_130.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
             super__Vector_impl_data._M_start ==
             local_130.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (!bVar11) {
      local_158 = &__return_storage_ptr__->result;
      local_b0 = &__return_storage_ptr__->target;
      pvVar10 = (value *)local_130.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      do {
        eval((value *)local_118,this,(expression *)local_148);
        local_d8._0_4_ = string;
        local_d0.n_ = (double)*(undefined8 *)pvVar10;
        local_d0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
             *(undefined4 *)&pvVar10->field_1;
        if (local_d0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
            (gc_heap *)0x0) {
          gc_heap::attach(local_d0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                          heap_,(gc_heap_ptr_untyped *)(local_d8 + 8));
        }
        put_value(this,(value *)local_118,(value *)local_d8);
        value::destroy((value *)local_d8);
        value::destroy((value *)local_118);
        eval((completion *)local_118,this,
             (s->s_)._M_t.
             super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
             super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
             super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
        local_70.type = local_118._0_4_;
        value::operator=(&local_70.result,(value *)local_110);
        local_70.target._M_len = local_e8;
        local_70.target._M_str = pwStack_e0;
        value::destroy((value *)local_110);
        bVar5 = handle_completion(&local_70,&local_178);
        if (bVar5) {
          __return_storage_ptr__->type = local_70.type;
          value::value(local_158,&local_70.result);
          local_b0->_M_len = local_70.target._M_len;
          local_b0->_M_str = local_70.target._M_str;
          if (bVar5) break;
        }
        pvVar10 = (value *)&(pvVar10->field_1).o_.super_gc_heap_ptr_untyped.pos_;
        bVar11 = pvVar10 == local_150;
      } while (!bVar11);
    }
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_130);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_140);
    value::destroy(&local_98);
  }
  else {
    iVar6 = (**(code **)((long)(((s->init_)._M_t.
                                 super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                                 .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl)->
                               super_syntax_node)._vptr_syntax_node + 0x18))();
    if (iVar6 != 1) {
      __assert_fail("s.init().type() == statement_type::variable",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,999,"completion mjs::interpreter::impl::operator()(const for_in_statement &)");
    }
    psVar3 = (s->init_)._M_t.
             super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
             super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
             super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
    local_140._8_8_ = psVar3[1].super_syntax_node._vptr_syntax_node;
    if (*(long *)&psVar3[1].super_syntax_node.extend_.file.
                  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> - local_140._8_8_
        != 0x28) {
      __assert_fail("var_statement.l().size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,0x3e9,"completion mjs::interpreter::impl::operator()(const for_in_statement &)"
                   );
    }
    peVar4 = (((value_type *)local_140._8_8_)->init_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
    local_140._0_8_ = this;
    if (peVar4 == (expression *)0x0) {
      value::value((value *)local_118,(value *)&value::undefined);
    }
    else {
      eval(&local_98,this,
           (((value_type *)local_140._8_8_)->init_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
      get_value((value *)local_118,this,&local_98);
    }
    operator()::anon_class_16_2_3fe14ecb::operator()
              ((anon_class_16_2_3fe14ecb *)local_140,(value *)local_118);
    value::destroy((value *)local_118);
    if (peVar4 != (expression *)0x0) {
      value::destroy(&local_98);
    }
    eval((value *)local_118,this,
         (s->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
         _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value((value *)local_d8,this,(value *)local_118);
    value::destroy((value *)local_118);
    if ((1 < iVar1) && ((uint)local_d8._0_4_ < boolean)) {
      completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
      value::destroy((value *)local_d8);
      goto LAB_0011f682;
    }
    plVar8 = (long *)gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar8 + 0x88))(&local_a8,plVar8,local_d8);
    poVar9 = (object *)gc_heap_ptr_untyped::get(&local_a8);
    object::enumerable_property_names(&local_130,poVar9);
    local_148 = (value *)local_130.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    bVar11 = local_130.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
             super__Vector_impl_data._M_start ==
             local_130.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (!bVar11) {
      local_150 = &__return_storage_ptr__->result;
      local_158 = (value *)&__return_storage_ptr__->target;
      pvVar10 = (value *)local_130.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      do {
        local_118._0_4_ = throw_;
        local_110._0_8_ = *(undefined8 *)pvVar10;
        local_110._8_4_ = *(undefined4 *)&pvVar10->field_1;
        if ((gc_heap *)local_110._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_110._0_8_,(gc_heap_ptr_untyped *)local_110);
        }
        operator()::anon_class_16_2_3fe14ecb::operator()
                  ((anon_class_16_2_3fe14ecb *)local_140,(value *)local_118);
        value::destroy((value *)local_118);
        eval((completion *)local_118,this,
             (s->s_)._M_t.
             super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
             super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
             super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
        local_70.type = local_118._0_4_;
        value::operator=(&local_70.result,(value *)local_110);
        local_70.target._M_len = local_e8;
        local_70.target._M_str = pwStack_e0;
        value::destroy((value *)local_110);
        bVar5 = handle_completion(&local_70,&local_178);
        if (bVar5) {
          __return_storage_ptr__->type = local_70.type;
          value::value(local_150,&local_70.result);
          *(size_t *)local_158 = local_70.target._M_len;
          (local_158->field_1).n_ = (double)local_70.target._M_str;
          if (bVar5) break;
        }
        pvVar10 = (value *)&(pvVar10->field_1).o_.super_gc_heap_ptr_untyped.pos_;
        bVar11 = pvVar10 == local_148;
      } while (!bVar11);
    }
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_130);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
    value::destroy((value *)local_d8);
  }
  if (bVar11) {
    __return_storage_ptr__->type = local_70.type;
    value::value(&__return_storage_ptr__->result,&local_70.result);
    (__return_storage_ptr__->target)._M_len = local_70.target._M_len;
    (__return_storage_ptr__->target)._M_str = local_70.target._M_str;
  }
LAB_0011f682:
  value::destroy(&local_70.result);
  if (local_178.
      super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const for_in_statement& s) {
        const auto ls = get_labels(s);

        // In ES5.1 for (?? in null/undefined) is just a no-op
        auto skip = [ver = global_->language_version()](value_type t) { return ver >= version::es5 && (t == value_type::undefined || t == value_type::null); };

        completion c{};
        if (s.init().type() == statement_type::expression) {
            auto ev = get_value(eval(s.e()));
            if (skip(ev.type())) {
                return completion{};
            }
            auto o = global_->to_object(ev);
            const auto& lhs_expression = static_cast<const expression_statement&>(s.init()).e();
            for (const auto& n: o->enumerable_property_names()) {
                put_value(eval(lhs_expression), value{n});
                c = eval(s.s());
                if (handle_completion(c, ls)) {
                    return c;
                }
            }
        } else {
            assert(s.init().type() == statement_type::variable);
            const auto& var_statement = static_cast<const variable_statement&>(s.init());
            assert(var_statement.l().size() == 1);
            const auto& init = var_statement.l()[0];

            auto assign = [&](const value& val) {
                put_value(value{active_scope_->lookup(init.id())}, val);
            };

            assign(init.init() ? get_value(eval(*init.init())) : value::undefined);

            // Happens after the initial assignment
            auto ev = get_value(eval(s.e()));
            if (skip(ev.type())) {
                return completion{};
            }
            auto o = global_->to_object(ev);

            for (const auto& n: o->enumerable_property_names()) {
                assign(value{n});
                c = eval(s.s());
                if (handle_completion(c, ls)) {
                    return c;
                }
            }
        }
        return c;
    }